

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension.h
# Opt level: O0

bool absl::lts_20250127::str_format_internal::FormatConversionCharIsUpper(FormatConversionChar c)

{
  undefined1 local_9;
  FormatConversionChar c_local;
  
  if ((((c == 7) || (c == 9)) || (c == 0xb)) || ((c == 0xd || (c == 0xf)))) {
    local_9 = true;
  }
  else {
    local_9 = false;
  }
  return local_9;
}

Assistant:

inline bool FormatConversionCharIsUpper(FormatConversionChar c) {
  if (c == FormatConversionCharInternal::X ||
      c == FormatConversionCharInternal::F ||
      c == FormatConversionCharInternal::E ||
      c == FormatConversionCharInternal::G ||
      c == FormatConversionCharInternal::A) {
    return true;
  } else {
    return false;
  }
}